

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

Value * cmFileAPI::BuildReplyError(Value *__return_storage_ptr__,string *error)

{
  Value *this;
  Value VStack_38;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&VStack_38,error);
  this = Json::Value::operator[](__return_storage_ptr__,"error");
  Json::Value::operator=(this,&VStack_38);
  Json::Value::~Value(&VStack_38);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildReplyError(std::string const& error)
{
  Json::Value e = Json::objectValue;
  e["error"] = error;
  return e;
}